

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O1

void __thiscall Snes_Spc::dsp_write(Snes_Spc *this,int data,rel_time_t time)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  bVar2 = (this->m).smp_regs[0][2];
  iVar3 = (this->m).dsp_time;
  uVar7 = time - (this->reg_times[bVar2] + iVar3);
  if ((int)uVar7 < 0) {
    if (iVar3 == 0x7f) {
      if (bVar2 == 0x5c) {
        piVar1 = &(this->m).skipped_koff;
        *piVar1 = *piVar1 | data;
        piVar1 = &(this->m).skipped_kon;
        *piVar1 = *piVar1 & ~data;
      }
      else if (bVar2 == 0x4c) {
        piVar1 = &(this->m).skipped_kon;
        *piVar1 = *piVar1 | ~(uint)(this->dsp).m.regs[0x5c] & data;
      }
    }
  }
  else {
    uVar7 = uVar7 & 0x7fffffe0;
    (this->m).dsp_time = uVar7 + iVar3 + 0x20;
    Spc_Dsp::run(&this->dsp,uVar7 + 0x20);
  }
  bVar2 = (this->m).smp_regs[0][2];
  if (-1 < (char)bVar2) {
    (this->dsp).m.regs[(uint)bVar2] = (uint8_t)data;
    if ((bVar2 & 0xf) < 2) {
      uVar5 = (ulong)(bVar2 & 0x70);
      uVar8 = (uint)(char)(this->dsp).m.regs[uVar5];
      uVar6 = (uint)(char)(this->dsp).m.regs[uVar5 + 1];
      uVar9 = (int)uVar8 >> 7;
      uVar7 = (int)uVar6 >> 7;
      if ((this->dsp).m.surround_threshold <= (int)(uVar6 * uVar8)) {
        uVar9 = 0;
        uVar7 = 0;
      }
      uVar5 = (ulong)((uint)(bVar2 >> 4) * 0x90);
      uVar4 = *(uint *)((long)(this->dsp).m.voices[0].volume + uVar5 + 8);
      *(uint *)((long)(this->dsp).m.voices[0].volume + uVar5) = (uVar9 ^ uVar8) & uVar4;
      *(uint *)((long)(this->dsp).m.voices[0].volume + uVar5 + 4) = (uVar7 ^ uVar6) & uVar4;
    }
    else if ((bVar2 & 0xf) == 0xc) {
      if (bVar2 == 0x7c) {
        (this->dsp).m.regs[0x7c] = '\0';
      }
      else if (bVar2 == 0x4c) {
        (this->dsp).m.new_kon = data & 0xff;
      }
    }
  }
  return;
}

Assistant:

inline void Snes_Spc::dsp_write( int data, rel_time_t time )
{
	RUN_DSP( time, reg_times [REGS [r_dspaddr]] )
	#if SPC_LESS_ACCURATE
		else if ( m.dsp_time == skipping_time )
		{
			int r = REGS [r_dspaddr];
			if ( r == Spc_Dsp::r_kon )
				m.skipped_kon |= data & ~dsp.read( Spc_Dsp::r_koff );
			
			if ( r == Spc_Dsp::r_koff )
			{
				m.skipped_koff |= data;
				m.skipped_kon &= ~data;
			}
		}
	#endif
	
	#ifdef SPC_DSP_WRITE_HOOK
		SPC_DSP_WRITE_HOOK( m.spc_time + time, REGS [r_dspaddr], (uint8_t) data );
	#endif
	
	if ( REGS [r_dspaddr] <= 0x7F )
		dsp.write( REGS [r_dspaddr], data );
	else if ( !SPC_MORE_ACCURACY )
		debug_printf( "SPC wrote to DSP register > $7F\n" );
}